

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

word wwShLoCarry(word *a,size_t n,size_t shift,word carry)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  word *pwVar4;
  ulong uVar5;
  word wVar6;
  word wVar7;
  ulong uVar8;
  
  uVar2 = n * 0x40 + 0x40;
  uVar8 = shift - uVar2;
  if (shift < uVar2) {
    uVar2 = shift >> 6;
    bVar1 = (byte)shift;
    bVar3 = bVar1 & 0x3f;
    if (shift < 0x40) {
      wVar7 = 0;
    }
    else {
      wVar7 = a[uVar2 - 1] >> bVar3;
    }
    if ((shift & 0x3f) == 0) {
      uVar5 = n - uVar2;
      uVar8 = uVar5;
      pwVar4 = a;
      if (n < uVar2 || uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        do {
          *pwVar4 = pwVar4[uVar2];
          uVar8 = uVar8 - 1;
          pwVar4 = pwVar4 + 1;
        } while (uVar8 != 0);
      }
    }
    else {
      wVar6 = carry;
      if (uVar2 < n) {
        wVar6 = a[uVar2];
      }
      if (uVar2 + 1 < n) {
        uVar5 = ~uVar2 + n;
        pwVar4 = a;
        do {
          *pwVar4 = a[uVar2] >> (bVar1 & 0x3f) | a[uVar2 + 1] << 0x40 - (bVar1 & 0x3f);
          uVar2 = uVar2 + 1;
          pwVar4 = pwVar4 + 1;
        } while (n - 1 != uVar2);
      }
      else {
        uVar5 = 0;
      }
      wVar7 = wVar7 | wVar6 << (-bVar3 & 0x3f);
      if (uVar2 < n) {
        a[uVar5] = a[uVar2] >> (bVar1 & 0x3f) | carry << 0x40 - (bVar1 & 0x3f);
        uVar5 = uVar5 + 1;
      }
    }
    if (uVar5 < n) {
      a[uVar5] = carry >> bVar3;
      uVar5 = uVar5 + 1;
    }
    if (uVar5 <= n && n - uVar5 != 0) {
      memset(a + uVar5,0,(n - uVar5) * 8);
    }
  }
  else {
    if (n != 0) {
      memset(a,0,n << 3);
    }
    wVar7 = 0;
    if (uVar8 < 0x40) {
      wVar7 = carry >> ((byte)uVar8 & 0x3f);
    }
  }
  return wVar7;
}

Assistant:

word wwShLoCarry(word a[], size_t n, size_t shift, word carry)
{
	register word ret = 0;
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * (n + 1))
	{
		size_t wshift = shift / B_PER_W, pos;
		shift %= B_PER_W;
		// сохраняем вытесняемые разряды
		if (wshift)
			ret = a[wshift - 1] >> shift;
		// величина сдвига не кратна длине слова?
		if (shift)
		{
			// дополнительные вытесняемые разряды
			if (wshift < n)
				ret |= a[wshift] << (B_PER_W - shift);
			else
				ret |= carry << (B_PER_W - shift);
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// предпоследнее слово
			if (pos + wshift < n)
			{
				a[pos] = a[pos + wshift] >> shift | carry << (B_PER_W - shift);
				++pos;
			}
		}
		// величина сдвига кратна длине слова
		else
		{
			for (pos = 0; pos + wshift < n; pos++)
				a[pos] = a[pos + wshift];
		}
		// последние слова
		if (pos < n)
			a[pos++] = carry >> shift;
		for (; pos < n; a[pos++] = 0);
	}
	else
	{
		wwSetZero(a, n);
		shift -= B_PER_W * (n + 1);
		if (shift < B_PER_W)
			ret = carry >> shift;
	}
	return ret;
}